

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void copy_tensor(TENSOR *src,int copy_channels,int dst_offset,TENSOR *dst)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int r;
  int c_1;
  int c;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  if ((*(int *)(in_RDI + 0x10) == *(int *)(in_RCX + 8)) &&
     (*(int *)(in_RCX + 0x10) == *(int *)(in_RCX + 8))) {
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      memcpy(*(void **)(in_RCX + 0x18 + (long)(in_EDX + local_1c) * 8),
             *(void **)(in_RDI + 0x18 + (long)local_1c * 8),
             (long)*(int *)(in_RDI + 8) * 4 * (long)*(int *)(in_RDI + 0xc));
    }
  }
  else {
    for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < *(int *)(in_RCX + 0xc); local_24 = local_24 + 1) {
        memcpy((void *)(*(long *)(in_RCX + 0x18 + (long)(in_EDX + local_20) * 8) +
                       (long)(local_24 * *(int *)(in_RCX + 0x10)) * 4),
               (void *)(*(long *)(in_RDI + 0x18 + (long)local_20 * 8) +
                       (long)(local_24 * *(int *)(in_RDI + 0x10)) * 4),
               (long)*(int *)(in_RCX + 8) << 2);
      }
    }
  }
  return;
}

Assistant:

static void copy_tensor(const TENSOR *src, int copy_channels, int dst_offset,
                        TENSOR *dst) {
  assert(src->width == dst->width);
  assert(src->height == dst->height);
  assert(copy_channels <= src->channels);
  if (src->stride == dst->width && dst->stride == dst->width) {
    for (int c = 0; c < copy_channels; ++c) {
      memcpy(dst->buf[dst_offset + c], src->buf[c],
             sizeof(*dst->buf[0]) * src->width * src->height);
    }
  } else {
    for (int c = 0; c < copy_channels; ++c) {
      for (int r = 0; r < dst->height; ++r) {
        memcpy(&dst->buf[dst_offset + c][r * dst->stride],
               &src->buf[c][r * src->stride],
               dst->width * sizeof(*dst->buf[c]));
      }
    }
  }
}